

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

bool absl::SimpleAtob(string_view str,Nonnull<bool_*> out)

{
  string_view piece2;
  string_view piece2_00;
  string_view piece2_01;
  string_view piece2_02;
  string_view piece2_03;
  string_view piece2_04;
  string_view piece2_05;
  string_view piece2_06;
  string_view piece2_07;
  string_view piece2_08;
  bool bVar1;
  undefined1 *in_RDX;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  char *in_RDI;
  char *absl_raw_log_internal_basename;
  char *in_stack_fffffffffffffea8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffeb0;
  size_t in_stack_fffffffffffffec8;
  char *pcVar2;
  char *in_stack_fffffffffffffed0;
  basic_string_view<char,_std::char_traits<char>_> *pbVar3;
  string_view in_stack_fffffffffffffed8;
  
  if (in_RDX == (undefined1 *)0x0) {
    raw_log_internal::RawLog
              (kFatal,"numbers.cc",0x70,"Check %s failed: %s","out != nullptr",
               "Output pointer must not be nullptr.");
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                  ,0x70,"bool absl::SimpleAtob(absl::string_view, absl::Nonnull<bool *>)");
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  piece2._M_str = in_stack_fffffffffffffed0;
  piece2._M_len = in_stack_fffffffffffffec8;
  bVar1 = EqualsIgnoreCase(in_stack_fffffffffffffed8,piece2);
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    piece2_00._M_str = in_stack_fffffffffffffed0;
    piece2_00._M_len = in_stack_fffffffffffffec8;
    bVar1 = EqualsIgnoreCase(in_stack_fffffffffffffed8,piece2_00);
    if (!bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      piece2_01._M_str = in_stack_fffffffffffffed0;
      piece2_01._M_len = in_stack_fffffffffffffec8;
      bVar1 = EqualsIgnoreCase(in_stack_fffffffffffffed8,piece2_01);
      if (!bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        piece2_02._M_str = in_stack_fffffffffffffed0;
        piece2_02._M_len = in_stack_fffffffffffffec8;
        bVar1 = EqualsIgnoreCase(in_stack_fffffffffffffed8,piece2_02);
        if (!bVar1) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
          piece2_03._M_str = in_stack_fffffffffffffed0;
          piece2_03._M_len = in_stack_fffffffffffffec8;
          bVar1 = EqualsIgnoreCase(in_stack_fffffffffffffed8,piece2_03);
          if (!bVar1) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
            piece2_04._M_str = in_stack_fffffffffffffed0;
            piece2_04._M_len = in_stack_fffffffffffffec8;
            bVar1 = EqualsIgnoreCase(in_stack_fffffffffffffed8,piece2_04);
            if (!bVar1) {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
              piece2_05._M_str = in_stack_fffffffffffffed0;
              piece2_05._M_len = in_stack_fffffffffffffec8;
              bVar1 = EqualsIgnoreCase(in_stack_fffffffffffffed8,piece2_05);
              if (!bVar1) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
                piece2_06._M_str = in_stack_fffffffffffffed0;
                piece2_06._M_len = in_stack_fffffffffffffec8;
                bVar1 = EqualsIgnoreCase(in_stack_fffffffffffffed8,piece2_06);
                if (!bVar1) {
                  pcVar2 = in_RDI;
                  pbVar3 = in_RSI;
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
                  piece2_07._M_str = (char *)pbVar3;
                  piece2_07._M_len = (size_t)pcVar2;
                  bVar1 = EqualsIgnoreCase(in_stack_fffffffffffffed8,piece2_07);
                  if (!bVar1) {
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (in_RSI,in_RDI);
                    piece2_08._M_str = (char *)pbVar3;
                    piece2_08._M_len = (size_t)pcVar2;
                    bVar1 = EqualsIgnoreCase(in_stack_fffffffffffffed8,piece2_08);
                    if (!bVar1) {
                      return false;
                    }
                  }
                }
              }
            }
            *in_RDX = 0;
            return true;
          }
        }
      }
    }
  }
  *in_RDX = 1;
  return true;
}

Assistant:

bool SimpleAtob(absl::string_view str, absl::Nonnull<bool*> out) {
  ABSL_RAW_CHECK(out != nullptr, "Output pointer must not be nullptr.");
  if (EqualsIgnoreCase(str, "true") || EqualsIgnoreCase(str, "t") ||
      EqualsIgnoreCase(str, "yes") || EqualsIgnoreCase(str, "y") ||
      EqualsIgnoreCase(str, "1")) {
    *out = true;
    return true;
  }
  if (EqualsIgnoreCase(str, "false") || EqualsIgnoreCase(str, "f") ||
      EqualsIgnoreCase(str, "no") || EqualsIgnoreCase(str, "n") ||
      EqualsIgnoreCase(str, "0")) {
    *out = false;
    return true;
  }
  return false;
}